

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_basic.c
# Opt level: O0

void publish_and_basic_get_message(char *msg_to_publish)

{
  int iVar1;
  char *__s2;
  size_t sVar2;
  char *in_RDI;
  amqp_connection_state_t unaff_retaddr;
  char *msg;
  uint64_t body_size;
  amqp_connection_state_t connection_state;
  char *in_stack_00000108;
  amqp_connection_state_t in_stack_00000110;
  uint64_t *in_stack_00000190;
  char *in_stack_00000198;
  amqp_connection_state_t in_stack_000001a0;
  size_t local_18;
  
  setup_connection_and_channel();
  queue_declare((amqp_connection_state_t)msg_to_publish,(char *)connection_state);
  basic_publish(in_stack_00000110,in_stack_00000108);
  __s2 = basic_get(in_stack_000001a0,in_stack_00000198,in_stack_00000190);
  sVar2 = strlen(in_RDI);
  if (local_18 != sVar2) {
    __assert_fail("body_size == strlen(msg_to_publish)",
                  "/workspace/llm4binary/github/license_c_cmakelists/alanxz[P]rabbitmq-c/tests/test_basic.c"
                  ,0x81,"void publish_and_basic_get_message(const char *)");
  }
  iVar1 = strncmp(in_RDI,__s2,local_18);
  if (iVar1 == 0) {
    free(__s2);
    close_and_destroy_connection(unaff_retaddr);
    return;
  }
  __assert_fail("strncmp(msg_to_publish, msg, body_size) == 0",
                "/workspace/llm4binary/github/license_c_cmakelists/alanxz[P]rabbitmq-c/tests/test_basic.c"
                ,0x82,"void publish_and_basic_get_message(const char *)");
}

Assistant:

void publish_and_basic_get_message(const char *msg_to_publish) {
  amqp_connection_state_t connection_state = setup_connection_and_channel();

  queue_declare(connection_state, test_queue_name);
  basic_publish(connection_state, msg_to_publish);

  uint64_t body_size;
  char *msg = basic_get(connection_state, test_queue_name, &body_size);

  assert(body_size == strlen(msg_to_publish));
  assert(strncmp(msg_to_publish, msg, body_size) == 0);
  free(msg);

  close_and_destroy_connection(connection_state);
}